

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall
QPlainTextEditControl::insertFromMimeData(QPlainTextEditControl *this,QMimeData *source)

{
  QPlainTextEdit *pQVar1;
  undefined8 in_RSI;
  QPlainTextEdit *ed;
  QMimeData *in_stack_00000058;
  QWidgetTextControl *in_stack_00000060;
  
  QObject::parent((QObject *)0x6bfeb1);
  pQVar1 = qobject_cast<QPlainTextEdit*>((QObject *)0x6bfeb9);
  if (pQVar1 == (QPlainTextEdit *)0x0) {
    QWidgetTextControl::insertFromMimeData(in_stack_00000060,in_stack_00000058);
  }
  else {
    (**(code **)(*(long *)&(pQVar1->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x1e0))
              (pQVar1,in_RSI);
  }
  return;
}

Assistant:

void QPlainTextEditControl::insertFromMimeData(const QMimeData *source) {
    QPlainTextEdit *ed = qobject_cast<QPlainTextEdit *>(parent());
    if (!ed)
        QWidgetTextControl::insertFromMimeData(source);
    else
        ed->insertFromMimeData(source);
}